

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

ArrayPtr<unsigned_char> * __thiscall
kj::_::NullableValue<kj::ArrayPtr<unsigned_char>>::emplace<kj::ArrayPtr<unsigned_char>>
          (NullableValue<kj::ArrayPtr<unsigned_char>> *this,ArrayPtr<unsigned_char> *params)

{
  ArrayPtr<unsigned_char> *params_00;
  ArrayPtr<unsigned_char> *params_local;
  NullableValue<kj::ArrayPtr<unsigned_char>_> *this_local;
  
  if (((byte)*this & 1) != 0) {
    *this = (NullableValue<kj::ArrayPtr<unsigned_char>>)0x0;
    dtor<kj::ArrayPtr<unsigned_char>>((ArrayPtr<unsigned_char> *)(this + 8));
  }
  params_00 = fwd<kj::ArrayPtr<unsigned_char>>(params);
  ctor<kj::ArrayPtr<unsigned_char>,kj::ArrayPtr<unsigned_char>>
            ((ArrayPtr<unsigned_char> *)(this + 8),params_00);
  *this = (NullableValue<kj::ArrayPtr<unsigned_char>>)0x1;
  return (ArrayPtr<unsigned_char> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }